

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

optional<std::shared_ptr<ReturnStatementAstNode>_> * __thiscall
Parser::parseReturnStatement
          (optional<std::shared_ptr<ReturnStatementAstNode>_> *__return_storage_ptr__,Parser *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  size_type *psVar1;
  int iVar2;
  undefined1 this_01 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  ReturnStatementAstNode *__p;
  bool bVar4;
  Parser local_98;
  size_type __dnew_1;
  shared_ptr<Token> returnToken;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_60;
  undefined1 local_50 [8];
  optional<std::shared_ptr<ExpressionAstNode>_> expression;
  bool error;
  
  expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
  super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._23_1_ = 0;
  local_50 = (undefined1  [8])0x11;
  returnToken.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = &local_60;
  returnToken.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::__cxx11::string::_M_create
                 ((ulong *)&returnToken.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount,(ulong)local_50);
  this_01 = local_50;
  this_00 = &returnToken.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  local_60._vptr__Sp_counted_base = (_func_int **)local_50;
  (returnToken.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _vptr__Sp_counted_base = (_func_int **)0x6465746365707845;
  *(undefined8 *)
   &(returnToken.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
    _M_use_count = 0x7275746572206120;
  *(undefined1 *)
   &returnToken.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
    _vptr__Sp_counted_base = 0x6e;
  *(undefined1 *)
   ((long)&(returnToken.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
           _vptr__Sp_counted_base + (long)local_50) = 0;
  expect((Parser *)&__dnew_1,(TokenType)this,(bool *)0xa,
         (string *)
         &expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
          _M_payload.super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>
          .super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>.field_0x17);
  if (returnToken.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      &local_60) {
    operator_delete(returnToken.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi,(ulong)((long)(_func_int ***)local_60._vptr__Sp_counted_base + 1));
  }
  skipWhiteSpace(this);
  expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
  super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_payload._8_1_ = 0;
  TokenBuffer::currentToken((TokenBuffer *)this_00);
  iVar2 = *(int *)&returnToken.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi[2]._vptr__Sp_counted_base;
  if (this_01 != (undefined1  [8])0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
  }
  if (iVar2 != 0x10) {
    parseExpression((optional<std::shared_ptr<ExpressionAstNode>_> *)this_00,this);
    std::_Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>::_M_copy_assign
              ((_Optional_payload_base<std::shared_ptr<ExpressionAstNode>_> *)local_50,
               (_Optional_payload_base<std::shared_ptr<ExpressionAstNode>_> *)this_00);
    if (((char)local_60._vptr__Sp_counted_base == '\x01') &&
       (local_60._vptr__Sp_counted_base =
             (_func_int **)((ulong)local_60._vptr__Sp_counted_base & 0xffffffffffffff00),
       this_01 != (undefined1  [8])0x0)) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
    }
  }
  local_98.out = (ostream *)0x32;
  returnToken.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = &local_60;
  returnToken.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::__cxx11::string::_M_create
                 ((ulong *)&returnToken.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount,(ulong)&local_98.out);
  local_60._vptr__Sp_counted_base = (_func_int **)local_98.out;
  returnToken.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
  _vptr__Sp_counted_base = (_func_int **)0x6e72757465722065;
  *(undefined8 *)
   &returnToken.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
    _M_use_count = 0x656d657461747320;
  returnToken.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _vptr__Sp_counted_base = (_func_int **)0x206f74206e6f6c6f;
  *(undefined8 *)
   &returnToken.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
    _M_use_count = 0x74616e696d726574;
  (returnToken.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _vptr__Sp_counted_base = (_func_int **)0x6465746365707845;
  *(undefined8 *)
   &(returnToken.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
    _M_use_count = 0x63696d6573206120;
  *(undefined2 *)
   &returnToken.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[3].
    _vptr__Sp_counted_base = 0x746e;
  local_98.out
  [(long)&(returnToken.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _vptr__Sp_counted_base] = (ostream)0x0;
  expect(&local_98,(TokenType)this,(bool *)0x10,
         (string *)
         &expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
          _M_payload.super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>
          .super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>.field_0x17);
  if (local_98.tokenBuffer.super___shared_ptr<TokenBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.tokenBuffer.super___shared_ptr<TokenBuffer,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (returnToken.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      &local_60) {
    operator_delete(returnToken.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi,(ulong)((long)local_60._vptr__Sp_counted_base + 1));
  }
  if (iVar2 != 0x10) {
    bVar4 = expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
            _M_payload.
            super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
            super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._23_1_ == '\0';
    expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
    super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._23_1_ = 1;
    if (bVar4) {
      expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
      super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
      super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._23_1_ =
           expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
           _M_payload.
           super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
           super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_payload._8_1_ ^ 1;
    }
  }
  if (expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
      super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
      super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._23_1_ == '\0') {
    if (iVar2 == 0x10) {
      p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x40);
      p_Var3->_M_use_count = 1;
      p_Var3->_M_weak_count = 1;
      p_Var3->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0012fd38;
      if (returnToken.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          psVar1 = &((returnToken.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    value)._M_string_length;
          *(int *)psVar1 = (int)*psVar1 + 1;
          UNLOCK();
        }
        else {
          psVar1 = &((returnToken.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    value)._M_string_length;
          *(int *)psVar1 = (int)*psVar1 + 1;
        }
      }
      __p = (ReturnStatementAstNode *)(p_Var3 + 1);
      p_Var3[1]._vptr__Sp_counted_base = (_func_int **)&PTR__ReturnStatementAstNode_0012fd88;
      p_Var3[1]._M_use_count = (undefined4)__dnew_1;
      p_Var3[1]._M_weak_count = __dnew_1._4_4_;
      p_Var3[2]._vptr__Sp_counted_base =
           (_func_int **)returnToken.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      *(undefined1 *)&p_Var3[3]._M_use_count = 0;
    }
    else {
      if (expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
          _M_payload.super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>
          .super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_payload._8_1_ ==
          '\0') {
        std::__throw_bad_optional_access();
      }
      p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x40);
      p_Var3->_M_use_count = 1;
      p_Var3->_M_weak_count = 1;
      p_Var3->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0012fd38;
      __p = (ReturnStatementAstNode *)(p_Var3 + 1);
      __gnu_cxx::new_allocator<ReturnStatementAstNode>::
      construct<ReturnStatementAstNode,std::shared_ptr<Token>&,std::shared_ptr<ExpressionAstNode>&>
                ((new_allocator<ReturnStatementAstNode> *)
                 &returnToken.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount,__p,
                 (shared_ptr<Token> *)&__dnew_1,(shared_ptr<ExpressionAstNode> *)local_50);
    }
    (__return_storage_ptr__->
    super__Optional_base<std::shared_ptr<ReturnStatementAstNode>,_false,_false>)._M_payload.
    super__Optional_payload<std::shared_ptr<ReturnStatementAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<ReturnStatementAstNode>_>._M_payload._M_value.
    super___shared_ptr<ReturnStatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = __p;
    (__return_storage_ptr__->
    super__Optional_base<std::shared_ptr<ReturnStatementAstNode>,_false,_false>)._M_payload.
    super__Optional_payload<std::shared_ptr<ReturnStatementAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<ReturnStatementAstNode>_>._M_payload._M_value.
    super___shared_ptr<ReturnStatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         p_Var3;
    bVar4 = true;
  }
  else {
    bVar4 = false;
  }
  (__return_storage_ptr__->
  super__Optional_base<std::shared_ptr<ReturnStatementAstNode>,_false,_false>)._M_payload.
  super__Optional_payload<std::shared_ptr<ReturnStatementAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<ReturnStatementAstNode>_>._M_engaged = bVar4;
  if ((expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
       super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
       super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_payload._8_1_ == '\x01')
     && (expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
         _M_payload.super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
         super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_payload._8_1_ = 0,
        expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload
        .super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
        super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_payload._M_value.
        super___shared_ptr<ExpressionAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
               _M_payload.
               super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
               super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_payload._M_value
               .super___shared_ptr<ExpressionAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if (returnToken.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               returnToken.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::optional<std::shared_ptr<ReturnStatementAstNode>>
Parser::parseReturnStatement() noexcept {
  bool error = false;

  auto returnToken = this->expect(TokenType::Return, error, "Expected a return");

  this->skipWhiteSpace();

  bool foundExpression = false;
  std::optional<std::shared_ptr<ExpressionAstNode>> expression{std::nullopt};

  if (this->tokenBuffer->currentToken()->tokenType != TokenType::SemiColon) {
    foundExpression = true;
    expression = this->parseExpression();
  }

  this->expect(TokenType::SemiColon, error, "Expected a semicolon to terminate return statement");

  if (foundExpression) {
    error = error || !expression;
  }

  if (error) { return std::nullopt; }

  if (foundExpression) {
    return std::make_shared<ReturnStatementAstNode>(returnToken, expression.value());
  }

  return std::make_shared<ReturnStatementAstNode>(returnToken);
}